

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# virtualfileentry.cpp
# Opt level: O1

size_t __thiscall
sai::VirtualFileEntry::Read
          (VirtualFileEntry *this,span<std::byte,_18446744073709551615UL> Destination)

{
  int iVar1;
  element_type *peVar2;
  bool bVar3;
  int iVar4;
  void *__s;
  ulong uVar5;
  __extent_storage<18446744073709551615UL> _Var6;
  size_t __n;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *this_00;
  __extent_storage<18446744073709551615UL> _Var7;
  bool bVar8;
  bool bVar9;
  VirtualPage local_1030;
  
  _Var6 = Destination._M_extent._M_extent_value;
  this_00 = (this->FileStream).super___weak_ptr<sai::ifstream,_(__gnu_cxx::_Lock_policy)2>.
            _M_refcount._M_pi;
  if (this_00 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    iVar4 = this_00->_M_use_count;
    do {
      if (iVar4 == 0) {
        this_00 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
        break;
      }
      LOCK();
      iVar1 = this_00->_M_use_count;
      bVar9 = iVar4 == iVar1;
      if (bVar9) {
        this_00->_M_use_count = iVar4 + 1;
        iVar1 = iVar4;
      }
      iVar4 = iVar1;
      UNLOCK();
    } while (!bVar9);
  }
  if (this_00 == (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    bVar9 = true;
  }
  else {
    bVar9 = this_00->_M_use_count == 0;
  }
  peVar2 = (this->FileStream).super___weak_ptr<sai::ifstream,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  _Var7._M_extent_value = _Var6._M_extent_value;
  if (!(bool)(peVar2 == (element_type *)0x0 | bVar9)) {
    __s = operator_new__(0x1000);
    memset(__s,0,0x1000);
    bVar9 = false;
    do {
      std::istream::seekg((long)peVar2,(int)(this->PageIndex << 0xc) + (int)this->PageOffset);
      uVar5 = this->PageOffset + _Var7._M_extent_value;
      __n = _Var7._M_extent_value;
      if (0xfff < uVar5) {
        bVar9 = true;
        __n = 0x1000 - this->PageOffset;
        uVar5 = 0;
      }
      this->PageOffset = uVar5;
      std::istream::read((char *)peVar2,(long)__s);
      memcpy(Destination._M_ptr + (_Var6._M_extent_value - _Var7._M_extent_value),__s,__n);
      this->Offset = this->Offset + __n;
      _Var7._M_extent_value = _Var7._M_extent_value - __n;
      bVar8 = bVar9;
      if (bVar9) {
        GetTablePage(&local_1030,this,this->PageIndex);
        this->PageIndex =
             (ulong)*(uint *)((long)&local_1030 + (ulong)((uint)this->PageIndex & 0x1ff) * 8 + 4);
        bVar8 = false;
      }
      bVar3 = bVar9 || _Var7._M_extent_value != 0;
      bVar9 = bVar8;
    } while (bVar3);
    operator_delete__(__s);
  }
  if (this_00 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(this_00);
  }
  return _Var6._M_extent_value - _Var7._M_extent_value;
}

Assistant:

std::size_t VirtualFileEntry::Read(std::span<std::byte> Destination)
{
	std::size_t LeftToRead    = Destination.size();
	bool        NeedsNextPage = false;

	if( std::shared_ptr<ifstream> Stream = FileStream.lock() )
	{
		std::unique_ptr<std::byte[]> ReadBuffer
			= std::make_unique<std::byte[]>(VirtualPage::PageSize);

		while( Stream )
		{
			Stream->seekg(PageIndex * VirtualPage::PageSize + PageOffset, std::ios::beg);

			std::size_t Read;
			if( LeftToRead + PageOffset >= VirtualPage::PageSize )
			{
				Read          = VirtualPage::PageSize - PageOffset;
				PageOffset    = 0;
				NeedsNextPage = true;
			}
			else
			{
				Read = LeftToRead;
				PageOffset += Read;
			}

			Stream->read(reinterpret_cast<char*>(ReadBuffer.get()), Read);
			const std::size_t BytesWritten = Destination.size() - LeftToRead;
			std::memcpy(Destination.data() + BytesWritten, ReadBuffer.get(), Read);

			Offset += Read;
			LeftToRead -= Read;

			if( NeedsNextPage )
			{
				// NOTE: The reason this is here, instead of moving it into the
				// `if (LeftToRead...)` is because `GetTablePage` seeks the
				// stream which mess-ups its position.
				PageIndex = GetTablePage(PageIndex)
								.PageEntries[PageIndex % VirtualPage::TableSpan]
								.NextPageIndex;
				NeedsNextPage = false;
			}
			else if( LeftToRead == 0 )
				break;
		}
	}

	return Destination.size() - LeftToRead;
}